

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_crypt.cc
# Opt level: O0

int rsa_padding_check_PKCS1_type_2
              (uint8_t *out,size_t *out_len,size_t max_out,uint8_t *from,size_t from_len)

{
  crypto_word_t cVar1;
  crypto_word_t cVar2;
  crypto_word_t cVar3;
  ulong n;
  size_t msg_len;
  crypto_word_t valid_index;
  crypto_word_t equals0;
  size_t i;
  crypto_word_t looking_for_index;
  crypto_word_t zero_index;
  crypto_word_t second_byte_is_two;
  crypto_word_t first_byte_is_zero;
  size_t from_len_local;
  uint8_t *from_local;
  size_t max_out_local;
  size_t *out_len_local;
  uint8_t *out_local;
  
  if (from_len == 0) {
    ERR_put_error(4,0,0x78,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                  ,0xf7);
    out_local._4_4_ = 0;
  }
  else if (from_len < 0xb) {
    ERR_put_error(4,0,0x7e,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                  ,0x100);
    out_local._4_4_ = 0;
  }
  else {
    cVar1 = constant_time_eq_w((ulong)*from,0);
    cVar2 = constant_time_eq_w((ulong)from[1],2);
    looking_for_index = 0;
    i = 0xffffffffffffffff;
    for (equals0 = 2; equals0 < from_len; equals0 = equals0 + 1) {
      cVar3 = constant_time_is_zero_w((ulong)from[equals0]);
      looking_for_index = constant_time_select_w(i & cVar3,equals0,looking_for_index);
      i = constant_time_select_w(cVar3,0,i);
    }
    cVar3 = constant_time_ge_w(looking_for_index,10);
    if ((cVar3 & (i ^ 0xffffffffffffffff) & cVar2 & cVar1) == 0) {
      ERR_put_error(4,0,0x89,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                    ,0x125);
      out_local._4_4_ = 0;
    }
    else {
      n = from_len - (looking_for_index + 1);
      if (max_out < n) {
        ERR_put_error(4,0,0x89,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                      ,0x12d);
        out_local._4_4_ = 0;
      }
      else {
        OPENSSL_memcpy(out,from + looking_for_index + 1,n);
        *out_len = n;
        out_local._4_4_ = 1;
      }
    }
  }
  return out_local._4_4_;
}

Assistant:

static int rsa_padding_check_PKCS1_type_2(uint8_t *out, size_t *out_len,
                                          size_t max_out, const uint8_t *from,
                                          size_t from_len) {
  if (from_len == 0) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_EMPTY_PUBLIC_KEY);
    return 0;
  }

  // PKCS#1 v1.5 decryption. See "PKCS #1 v2.2: RSA Cryptography
  // Standard", section 7.2.2.
  if (from_len < RSA_PKCS1_PADDING_SIZE) {
    // |from| is zero-padded to the size of the RSA modulus, a public value, so
    // this can be rejected in non-constant time.
    OPENSSL_PUT_ERROR(RSA, RSA_R_KEY_SIZE_TOO_SMALL);
    return 0;
  }

  crypto_word_t first_byte_is_zero = constant_time_eq_w(from[0], 0);
  crypto_word_t second_byte_is_two = constant_time_eq_w(from[1], 2);

  crypto_word_t zero_index = 0, looking_for_index = CONSTTIME_TRUE_W;
  for (size_t i = 2; i < from_len; i++) {
    crypto_word_t equals0 = constant_time_is_zero_w(from[i]);
    zero_index =
        constant_time_select_w(looking_for_index & equals0, i, zero_index);
    looking_for_index = constant_time_select_w(equals0, 0, looking_for_index);
  }

  // The input must begin with 00 02.
  crypto_word_t valid_index = first_byte_is_zero;
  valid_index &= second_byte_is_two;

  // We must have found the end of PS.
  valid_index &= ~looking_for_index;

  // PS must be at least 8 bytes long, and it starts two bytes into |from|.
  valid_index &= constant_time_ge_w(zero_index, 2 + 8);

  // Skip the zero byte.
  zero_index++;

  // NOTE: Although this logic attempts to be constant time, the API contracts
  // of this function and |RSA_decrypt| with |RSA_PKCS1_PADDING| make it
  // impossible to completely avoid Bleichenbacher's attack. Consumers should
  // use |RSA_PADDING_NONE| and perform the padding check in constant-time
  // combined with a swap to a random session key or other mitigation.
  CONSTTIME_DECLASSIFY(&valid_index, sizeof(valid_index));
  CONSTTIME_DECLASSIFY(&zero_index, sizeof(zero_index));

  if (!valid_index) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_PKCS_DECODING_ERROR);
    return 0;
  }

  const size_t msg_len = from_len - zero_index;
  if (msg_len > max_out) {
    // This shouldn't happen because this function is always called with
    // |max_out| as the key size and |from_len| is bounded by the key size.
    OPENSSL_PUT_ERROR(RSA, RSA_R_PKCS_DECODING_ERROR);
    return 0;
  }

  OPENSSL_memcpy(out, &from[zero_index], msg_len);
  *out_len = msg_len;
  return 1;
}